

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool __thiscall QDirPrivate::exists(QDirPrivate *this)

{
  QAbstractFileEngine *pQVar1;
  byte bVar2;
  uint uVar3;
  
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 == (QAbstractFileEngine *)0x0) {
    QFileSystemEngine::fillMetaData
              (&this->dirEntry,&(this->fileCache).metaData,(MetaDataFlags)0x440000);
    uVar3 = (this->fileCache).metaData.entryFlags.
            super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
            super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
    if ((uVar3 >> 0x16 & 1) == 0) {
      return false;
    }
    bVar2 = (byte)(uVar3 >> 0x12);
  }
  else {
    uVar3 = (*pQVar1->_vptr_QAbstractFileEngine[0x16])(pQVar1,0x1440000);
    if ((uVar3 >> 0x12 & 1) == 0) {
      return false;
    }
    bVar2 = (byte)(uVar3 >> 0x16);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QDirPrivate::exists() const
{
    if (!fileEngine) {
        QMutexLocker locker(&fileCache.mutex);
        QFileSystemEngine::fillMetaData(
                dirEntry, fileCache.metaData,
                QFileSystemMetaData::ExistsAttribute
                        | QFileSystemMetaData::DirectoryType); // always stat
        return fileCache.metaData.exists() && fileCache.metaData.isDirectory();
    }
    const QAbstractFileEngine::FileFlags info =
        fileEngine->fileFlags(QAbstractFileEngine::DirectoryType
                                       | QAbstractFileEngine::ExistsFlag
                                       | QAbstractFileEngine::Refresh);
    if (!(info & QAbstractFileEngine::DirectoryType))
        return false;
    return info.testAnyFlag(QAbstractFileEngine::ExistsFlag);
}